

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  void *pvVar1;
  string *initial_value;
  Version *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorRequest_00426ea0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->file_to_generate_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
             &(from->file_to_generate_).super_RepeatedPtrFieldBase);
  (this->proto_file_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
            (&(this->proto_file_).super_RepeatedPtrFieldBase,
             &(from->proto_file_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->parameter_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->parameter_).ptr_,
     initial_value != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->parameter_,initial_value);
  }
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    this_00 = (Version *)0x0;
  }
  else {
    this_00 = (Version *)operator_new(0x30);
    Version::Version(this_00,from->compiler_version_);
  }
  this->compiler_version_ = this_00;
  return;
}

Assistant:

CodeGeneratorRequest::CodeGeneratorRequest(const CodeGeneratorRequest& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      file_to_generate_(from.file_to_generate_),
      proto_file_(from.proto_file_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  parameter_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_parameter()) {
    parameter_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.parameter_);
  }
  if (from.has_compiler_version()) {
    compiler_version_ = new ::google::protobuf::compiler::Version(*from.compiler_version_);
  } else {
    compiler_version_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorRequest)
}